

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall
QL_Manager::Select(QL_Manager *this,int nSelAttrs,RelAttr *selAttrs,int nRelations,char **relations,
                  int nConditions,Condition *conditions)

{
  uint uVar1;
  RelAttr *selAttrs_00;
  RC RVar2;
  ostream *poVar3;
  QL_Manager *pQVar4;
  RelCatEntry *relEntries;
  AttrCatEntry *pAVar5;
  QO_Manager *this_00;
  QO_Rel *relOrder;
  long lVar6;
  ulong uVar7;
  int iVar8;
  Condition *c;
  ulong uVar9;
  ulong uVar10;
  RC local_b8;
  float tupleEst;
  RelAttr *local_80;
  float cost;
  QL_Node *topNode;
  int local_38;
  
  if (this->smm->printPageStats == true) {
    SM_Manager::ResetPageStats(this->smm);
  }
  std::operator<<((ostream *)&std::cout,"Select\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   nSelAttrs = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nSelAttrs);
  std::operator<<(poVar3,"\n");
  uVar7 = 0;
  uVar9 = 0;
  local_80 = selAttrs;
  if (0 < nSelAttrs) {
    uVar9 = (ulong)(uint)nSelAttrs;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"   selAttrs[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar7);
    poVar3 = std::operator<<(poVar3,"]:");
    poVar3 = operator<<(poVar3,selAttrs);
    std::operator<<(poVar3,"\n");
    selAttrs = selAttrs + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"   nRelations = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nRelations);
  std::operator<<(poVar3,"\n");
  uVar9 = 0;
  uVar7 = 0;
  if (0 < nRelations) {
    uVar7 = (ulong)(uint)nRelations;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"   relations[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar9);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,relations[uVar9]);
    std::operator<<(poVar3,"\n");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"   nCondtions = ");
  pQVar4 = (QL_Manager *)std::ostream::operator<<(poVar3,nConditions);
  std::operator<<((ostream *)pQVar4,"\n");
  uVar9 = 0;
  uVar10 = 0;
  c = conditions;
  if (0 < nConditions) {
    uVar10 = (ulong)(uint)nConditions;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"   conditions[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar9);
    poVar3 = std::operator<<(poVar3,"]:");
    pQVar4 = (QL_Manager *)operator<<(poVar3,c);
    std::operator<<((ostream *)pQVar4,"\n");
    c = c + 1;
  }
  local_b8 = ParseRelNoDup(pQVar4,nRelations,relations);
  if (local_b8 == 0) {
    Reset(this);
    this->nRels = nRelations;
    this->nConds = nConditions;
    this->condptr = conditions;
    relEntries = (RelCatEntry *)malloc((long)nRelations * 0x34);
    this->relEntries = relEntries;
    relEntries->relName[0] = '\0';
    relEntries->relName[1] = '\0';
    relEntries->relName[2] = '\0';
    relEntries->relName[3] = '\0';
    relEntries->relName[4] = '\0';
    relEntries->relName[5] = '\0';
    relEntries->relName[6] = '\0';
    relEntries->relName[7] = '\0';
    relEntries->relName[8] = '\0';
    relEntries->relName[9] = '\0';
    relEntries->relName[10] = '\0';
    relEntries->relName[0xb] = '\0';
    relEntries->relName[0xc] = '\0';
    relEntries->relName[0xd] = '\0';
    relEntries->relName[0xe] = '\0';
    relEntries->relName[0xf] = '\0';
    relEntries->relName[0x10] = '\0';
    relEntries->relName[0x11] = '\0';
    relEntries->relName[0x12] = '\0';
    relEntries->relName[0x13] = '\0';
    relEntries->relName[0x14] = '\0';
    relEntries->relName[0x15] = '\0';
    relEntries->relName[0x16] = '\0';
    relEntries->relName[0x17] = '\0';
    *(undefined8 *)(relEntries->relName + 0x18) = 0;
    *(undefined4 *)&relEntries->statsInitialized = 0;
    relEntries->attrCount = 0;
    relEntries->indexCount = 0;
    relEntries->indexCurrNum = 0;
    relEntries->numTuples = 0;
    RVar2 = SM_Manager::GetAllRels
                      (this->smm,relEntries,nRelations,relations,&this->nAttrs,&this->relToInt);
    if (RVar2 == 0) {
      pAVar5 = (AttrCatEntry *)malloc((long)this->nAttrs * 0x54);
      this->attrEntries = pAVar5;
      iVar8 = 0;
      lVar6 = 0;
      do {
        selAttrs_00 = local_80;
        if (uVar7 * 0x34 + 0x34 == lVar6 + 0x34) {
          local_b8 = ParseSelectAttrs(this,nSelAttrs,local_80);
          if ((local_b8 == 0) &&
             (local_b8 = ParseConditions(this,nConditions,conditions), local_b8 == 0)) {
            if (this->smm->useQO == true) {
              this_00 = (QO_Manager *)operator_new(0x48);
              QO_Manager::QO_Manager
                        (this_00,this,this->nRels,this->relEntries,this->nAttrs,this->attrEntries,
                         this->nConds,this->condptr);
              uVar1 = this->nRels;
              relOrder = (QO_Rel *)malloc((long)(int)uVar1 * 0xc);
              lVar6 = 0;
              uVar7 = 0;
              if (0 < (int)uVar1) {
                uVar7 = (ulong)uVar1;
              }
              for (; uVar7 * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
                *(undefined8 *)((long)&relOrder->relIdx + lVar6) = 0xffffffff00000000;
                *(undefined4 *)((long)&relOrder->indexCond + lVar6) = 0xffffffff;
              }
              QO_Manager::Compute(this_00,relOrder,&cost,&tupleEst);
              QO_Manager::PrintRels(this_00);
              RecalcCondToRel(this,relOrder);
              RVar2 = SetUpNodesWithQO(this,&topNode,relOrder,nSelAttrs,selAttrs_00);
              if (RVar2 != 0) {
                return RVar2;
              }
              QO_Manager::~QO_Manager(this_00);
              operator_delete(this_00);
              free(relOrder);
            }
            else {
              RVar2 = SetUpNodes(this,&topNode,nSelAttrs,selAttrs_00);
              if (RVar2 != 0) {
                return RVar2;
              }
            }
            pQVar4 = this;
            RVar2 = RunSelect(this,topNode);
            if (RVar2 != 0) {
              return RVar2;
            }
            if (this->smm->useQO == true) {
              poVar3 = std::operator<<((ostream *)&std::cout,"estimated cost: ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,cost);
              std::endl<char,std::char_traits<char>>(poVar3);
              poVar3 = std::operator<<((ostream *)&std::cout,"estimated # tuples: ");
              pQVar4 = (QL_Manager *)std::ostream::operator<<(poVar3,tupleEst);
              std::endl<char,std::char_traits<char>>((ostream *)pQVar4);
            }
            if (bQueryPlans != 0) {
              poVar3 = std::operator<<((ostream *)&std::cout,"PRINTING QUERY PLAN");
              std::endl<char,std::char_traits<char>>(poVar3);
              pQVar4 = (QL_Manager *)topNode;
              (*topNode->_vptr_QL_Node[5])(topNode,0);
            }
            RVar2 = CleanUpNodes(pQVar4,topNode);
            if (RVar2 != 0) {
              return RVar2;
            }
            if (this->smm->printPageStats == true) {
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              SM_Manager::PrintPageStats(this->smm);
            }
            free(this->relEntries);
            free(this->attrEntries);
            return 0;
          }
          free(this->relEntries);
          pAVar5 = this->attrEntries;
          goto LAB_0010b9b5;
        }
        std::__cxx11::string::string
                  ((string *)&cost,this->relEntries->relName + lVar6,(allocator *)&topNode);
        std::__cxx11::string::string((string *)&topNode,(string *)&cost);
        local_38 = iVar8;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    *)&this->relToAttrIndex,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)&topNode);
        std::__cxx11::string::~string((string *)&topNode);
        RVar2 = SM_Manager::GetAttrForRel
                          (this->smm,(RelCatEntry *)(this->relEntries->relName + lVar6),
                           this->attrEntries + iVar8,&this->attrToRel);
        if (RVar2 == 0) {
          iVar8 = iVar8 + *(int *)(this->relEntries->relName + lVar6 + 0x20);
        }
        else {
          free(this->relEntries);
          free(this->attrEntries);
          local_b8 = RVar2;
        }
        std::__cxx11::string::~string((string *)&cost);
        lVar6 = lVar6 + 0x34;
      } while (RVar2 == 0);
    }
    else {
      pAVar5 = (AttrCatEntry *)this->relEntries;
      local_b8 = RVar2;
LAB_0010b9b5:
      free(pAVar5);
    }
  }
  return local_b8;
}

Assistant:

RC QL_Manager::Select(int nSelAttrs, const RelAttr selAttrs[],
                      int nRelations, const char * const relations[],
                      int nConditions, const Condition conditions[])
{
  int i;
  RC rc = 0;
  if(smm.printPageStats){
    smm.ResetPageStats();
  }

  cout << "Select\n";

  cout << "   nSelAttrs = " << nSelAttrs << "\n";
  for (i = 0; i < nSelAttrs; i++)
    cout << "   selAttrs[" << i << "]:" << selAttrs[i] << "\n";

  cout << "   nRelations = " << nRelations << "\n";
  for (i = 0; i < nRelations; i++)
    cout << "   relations[" << i << "] " << relations[i] << "\n";

  cout << "   nCondtions = " << nConditions << "\n";
  for (i = 0; i < nConditions; i++)
    cout << "   conditions[" << i << "]:" << conditions[i] << "\n";

  // Parse - relations have no duplicates
  if((rc = ParseRelNoDup(nRelations, relations)))
    return (rc);

  // Reset class query parameters
  Reset();
  nRels = nRelations;
  nConds = nConditions;
  condptr = conditions;

  // retrieve all relations
  relEntries = (RelCatEntry *)malloc(sizeof(RelCatEntry)*nRelations);
  memset((void*)relEntries, 0, sizeof(*relEntries));
  if((rc = smm.GetAllRels(relEntries, nRelations, relations, nAttrs, relToInt))){
    free(relEntries);
    return (rc);
  }

  // Retrieve all attributes
  attrEntries = (AttrCatEntry *)malloc(sizeof(AttrCatEntry)*nAttrs);
  int slot = 0;
  for(int i=0; i < nRelations; i++){
      string relString(relEntries[i].relName);
      relToAttrIndex.insert({relString, slot});
      if((rc = smm.GetAttrForRel(relEntries + i, attrEntries + slot, attrToRel))){
        free(relEntries);
        free(attrEntries);
        return (rc);
      }
      slot += relEntries[i].attrCount;
  }
  
  // Make sure the attributes and conditions are valid
  if((rc = ParseSelectAttrs(nSelAttrs, selAttrs))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }
  if((rc = ParseConditions(nConditions, conditions))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }
  /*
  QO_Manager *qom = new QO_Manager(*this, nRels, relEntries, nAttrs, attrEntries,
      nConds, condptr);
  QO_Rel * qorels = (QO_Rel*)(malloc(sizeof(QO_Rel)*nRels));
  for(int i=0; i < nRels; i++){
    *(qorels + i) = (QO_Rel){ 0.0, -1.0, -1.0};
  }
  qom->Compute(qorels);
  qom->PrintRels();
  delete qom;
  free(qorels);
  */
  QL_Node *topNode;
  float cost, tupleEst;
  if(smm.useQO){
    //cout << "using QO" << endl;
    QO_Manager *qom = new QO_Manager(*this, nRels, relEntries, nAttrs, attrEntries,
      nConds, condptr);
    QO_Rel * qorels = (QO_Rel*)(malloc(sizeof(QO_Rel)*nRels));
    for(int i=0; i < nRels; i++){
      *(qorels + i) = (QO_Rel){ 0, -1, -1};
    }
    qom->Compute(qorels, cost, tupleEst);
    qom->PrintRels();
    RecalcCondToRel(qorels);
    if((rc = SetUpNodesWithQO(topNode, qorels, nSelAttrs, selAttrs)))
      return (rc);
    /*
    for(int i=0; i < nRels; i++){
      int index = qorels[i].relIdx;
      cout << relEntries[index].relName << endl;
      cout << "  associated conds: ";
      for(int j=0; j < nConds; j++){
        if(conditionToRel[j] == index)
          cout << j;
        }
        cout << endl;
      }
      */

    delete qom;
    free(qorels);
  }
  else{
    // Construct the query tree
    if((rc = SetUpNodes(topNode, nSelAttrs, selAttrs)))
      return (rc);
  }

  

  //QL_Node *topNode;
  // Construct the query tree
  //if((rc = SetUpNodes(topNode, nSelAttrs, selAttrs)))
  //  return (rc);

  // Print the query tree
  

  
  // run select
  if((rc = RunSelect(topNode)))
    return (rc);

  if(smm.useQO){
    cout << "estimated cost: " << cost << endl;
    cout << "estimated # tuples: " << tupleEst << endl;
  }
    

  if(bQueryPlans){
    cout << "PRINTING QUERY PLAN" <<endl;
    topNode->PrintNode(0);
  }

  
  // clean up query tree
  if((rc = CleanUpNodes(topNode)))
    return (rc);

  if(smm.printPageStats){
    cout << endl;
    smm.PrintPageStats();
  }
    
  free(relEntries);
  free(attrEntries);

  return (rc);
}